

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void testWriteRead(pixels *p,string *tempdir,exr_compression_t comp,char *pattern)

{
  int ys;
  int xs;
  int maxsampling;
  string cppfilename;
  string filename;
  int in_stack_00000494;
  int in_stack_00000498;
  undefined1 in_stack_0000049f;
  string *in_stack_000004a0;
  string *in_stack_000004a8;
  pixels *in_stack_000004b0;
  exr_compression_t in_stack_000004d0;
  char *in_stack_000004d8;
  int local_108;
  int local_104;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_d8 [32];
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  
  std::operator+(in_stack_ffffffffffffff08,
                 (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
             (allocator<char> *)in_stack_ffffffffffffff10);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string(local_60);
  std::operator+(in_stack_ffffffffffffff08,
                 (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
             (allocator<char> *)in_stack_ffffffffffffff10);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  std::__cxx11::string::~string(local_d8);
  for (local_104 = 1; local_104 < 3; local_104 = local_104 + 1) {
    for (local_108 = 1; local_108 < 3; local_108 = local_108 + 1) {
      doWriteRead(in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,(bool)in_stack_0000049f,
                  in_stack_00000498,in_stack_00000494,in_stack_000004d0,in_stack_000004d8);
      if ((local_104 == 1) && (local_108 == 1)) {
        doWriteRead(in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,(bool)in_stack_0000049f,
                    in_stack_00000498,in_stack_00000494,in_stack_000004d0,in_stack_000004d8);
      }
    }
  }
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void
testWriteRead (
    pixels&            p,
    const std::string& tempdir,
    exr_compression_t  comp,
    const char*        pattern)
{
    std::string filename =
        tempdir + pattern + std::string ("_imf_test_comp.exr");
    std::string cppfilename =
        tempdir + pattern + std::string ("_imf_test_comp_cpp.exr");
    const int maxsampling = 2;
    for (int xs = 1; xs <= maxsampling; ++xs)
    {
        for (int ys = 1; ys <= maxsampling; ++ys)
        {
            doWriteRead (
                p, filename, cppfilename, false, xs, ys, comp, pattern);
            if (xs == 1 && ys == 1)
                doWriteRead (
                    p, filename, cppfilename, true, xs, ys, comp, pattern);
        }
    }
}